

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::CacheValue(Debugger *this,int valueIndex,Idx<Variable> variable)

{
  lua_State *plVar1;
  int __val;
  uint uVar2;
  int iVar3;
  int iVar4;
  Variable *pVVar5;
  Idx<Variable> variable_local;
  string key;
  
  variable_local._arena = variable._arena;
  variable_local.Raw = variable.Raw;
  plVar1 = this->currentL;
  if (plVar1 != (lua_State *)0x0) {
    uVar2 = (*lua_type)(plVar1,valueIndex);
    __val = cacheId;
    if ((uVar2 & 0xfffffffd) == 5) {
      cacheId = cacheId + 1;
      pVVar5 = Idx<Variable>::operator->(&variable_local);
      pVVar5->cacheId = __val;
      iVar3 = (*lua_gettop)(plVar1);
      (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
      iVar4 = (*lua_type)(plVar1,-1);
      if (iVar4 == 0) {
        (*lua_settop)(plVar1,-2);
        (*lua_createtable)(plVar1,0,0);
        (*lua_setfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
        (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
      }
      (*lua_pushvalue)(plVar1,valueIndex);
      std::__cxx11::to_string(&key,__val);
      (*lua_setfield)(plVar1,-2,key._M_dataplus._M_p);
      (*lua_settop)(plVar1,iVar3);
      std::__cxx11::string::~string((string *)&key);
    }
  }
  return;
}

Assistant:

void Debugger::CacheValue(int valueIndex, Idx<Variable> variable) const {
	if (!currentL) {
		return;
	}

	auto L = currentL;

	const int type = lua_type(L, valueIndex);
	if (type == LUA_TUSERDATA || type == LUA_TTABLE) {
		const int id = cacheId++;
		variable->cacheId = id;
		const int top = lua_gettop(L);
		lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable|nil
		if (lua_isnil(L, -1)) {
			lua_pop(L, 1);                                       //
			lua_newtable(L);                                     // 1: {}
			lua_setfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);//
			lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable
		}

		lua_pushvalue(L, valueIndex);// 1: cacheTable, 2: value

		// snprintf 性能不够，问题也很大，这里采用c++标准算法
		std::string key = std::to_string(id);
		lua_setfield(L, -2, key.c_str());// 1: cacheTable

		lua_settop(L, top);
	}
}